

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

void duckdb::GetFieldIDs(Value *field_ids_value,ChildFieldIDs *field_ids,
                        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *unique_field_ids,case_insensitive_map_t<LogicalType> *name_to_type_map)

{
  LogicalType LVar1;
  char *pcVar2;
  size_type sVar3;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var4;
  _Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_*,_false>
  _Var5;
  optional_ptr<const_duckdb::Value,_true> oVar6;
  int iVar7;
  const_iterator cVar8;
  const_reference pvVar9;
  vector<duckdb::Value,_true> *this;
  char *pcVar10;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::FieldID>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::FieldID>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var11;
  undefined8 uVar12;
  undefined8 *puVar13;
  BinderException *pBVar14;
  InternalException *this_00;
  LogicalType *pLVar15;
  ulong __n;
  ulong __n_00;
  __node_base *p_Var16;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar17;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_false,_true>,_bool>
  pVar18;
  optional_ptr<const_duckdb::Value,_true> field_id_value;
  uint32_t field_id_int;
  string names;
  optional_ptr<const_duckdb::Value,_true> child_field_ids_value;
  FieldID field_id;
  __hashtable *__h;
  optional_ptr<const_duckdb::Value,_true> local_1a0;
  int32_t local_194;
  string local_190;
  undefined1 local_170 [32];
  float local_150;
  int32_t iStack_14c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Stack_148;
  __node_base_ptr local_140 [2];
  optional_ptr<const_duckdb::Value,_true> local_130;
  undefined8 local_128;
  _Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_*,_false>
  _Stack_120;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_118;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_110;
  vector<duckdb::Value,_true> *local_108;
  key_type local_100;
  ChildFieldIDs *local_e0;
  Value *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_110 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)unique_field_ids;
  local_e0 = field_ids;
  if (*field_ids_value != (Value)0x64) {
    pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,
               "Expected FIELD_IDS to be a STRUCT, e.g., {col1: 42, col2: {%s: 43, nested_col: 44}, col3: 44}"
               ,"");
    BinderException::BinderException<char_const*>(pBVar14,(string *)local_170,"__duckdb_field_id");
    __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_d8 = field_ids_value;
  local_108 = (vector<duckdb::Value,_true> *)duckdb::StructValue::GetChildren(field_ids_value);
  if ((local_108->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_108->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n_00 = 0;
    local_118 = &name_to_type_map->_M_h;
    do {
      duckdb::StructType::GetChildName_abi_cxx11_((LogicalType *)local_d8,__n_00);
      duckdb::StringUtil::Lower((string *)&local_100);
      iVar7 = std::__cxx11::string::compare((char *)&local_100);
      if (iVar7 != 0) {
        cVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&name_to_type_map->_M_h,&local_100);
        if (cVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_170._0_8_ = local_170 + 0x10;
          local_170._8_8_ = 0;
          local_170._16_8_ = local_170._16_8_ & 0xffffffffffffff00;
          p_Var16 = &local_118->_M_before_begin;
          while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
            if (local_170._8_8_ != 0) {
              std::__cxx11::string::append(local_170);
            }
            std::__cxx11::string::_M_append(local_170,(ulong)p_Var16[1]._M_nxt);
          }
          pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,
                     "Column name \"%s\" specified in FIELD_IDS not found. Consider using WRITE_PARTITION_COLUMNS if this column is a partition column. Available column names: [%s]"
                     ,"");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_100._M_dataplus._M_p,
                     local_100._M_dataplus._M_p + local_100._M_string_length);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_170._0_8_,
                     (pointer)(local_170._0_8_ + local_170._8_8_));
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar14,&local_190,&local_90,&local_b0);
          __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar9 = vector<duckdb::Value,_true>::operator[](local_108,__n_00);
        local_1a0.ptr = (const_reference)0x0;
        local_130.ptr = (const_reference)0x0;
        oVar6.ptr = pvVar9;
        if ((*pvVar9 == (value_type)0x64) &&
           (this = (vector<duckdb::Value,_true> *)duckdb::StructValue::GetChildren(pvVar9),
           oVar6.ptr = local_1a0.ptr,
           (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start)) {
          __n = 0;
          do {
            pcVar10 = (char *)duckdb::StructType::GetChildName_abi_cxx11_((LogicalType *)pvVar9,__n)
            ;
            iVar7 = std::__cxx11::string::compare(pcVar10);
            oVar6.ptr = pvVar9;
            if (iVar7 == 0) {
              local_1a0.ptr = vector<duckdb::Value,_true>::operator[](this,__n);
              oVar6.ptr = local_130.ptr;
            }
            local_130.ptr = oVar6.ptr;
            __n = __n + 1;
            oVar6.ptr = local_1a0.ptr;
          } while (__n < (ulong)((long)(this->
                                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->
                                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6));
        }
        local_1a0.ptr = oVar6.ptr;
        FieldID::FieldID((FieldID *)&local_128);
        if (local_1a0.ptr != (const_reference)0x0) {
          optional_ptr<const_duckdb::Value,_true>::CheckValid(&local_1a0);
          oVar6.ptr = local_1a0.ptr;
          duckdb::LogicalType::LogicalType((LogicalType *)&local_190,INTEGER);
          duckdb::Value::DefaultCastAs((LogicalType *)local_170,SUB81(oVar6.ptr,0));
          duckdb::LogicalType::~LogicalType((LogicalType *)&local_190);
          local_194 = duckdb::IntegerValue::Get((Value *)local_170);
          local_190._M_dataplus._M_p = (pointer)local_110;
          pVar17 = std::
                   _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   ::
                   _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                             (local_110,&local_194,&local_190);
          if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_190,"Duplicate field_id %s found in FIELD_IDS","");
            duckdb::Value::ToString_abi_cxx11_();
            BinderException::BinderException<std::__cxx11::string>(pBVar14,&local_190,&local_50);
            __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
          }
          FieldID::FieldID((FieldID *)&local_190,local_194);
          _Var5._M_head_impl =
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
                *)_Stack_120;
          local_128 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)local_190._M_dataplus._M_p;
          _Stack_120._M_head_impl =
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
                *)local_190._M_string_length;
          local_190._M_string_length = 0;
          if (_Var5._M_head_impl !=
              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
               *)0x0) {
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&(_Var5._M_head_impl)->_M_h);
            operator_delete(_Var5._M_head_impl);
          }
          sVar3 = local_190._M_string_length;
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_190._M_string_length !=
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)0x0) {
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_190._M_string_length);
            operator_delete((void *)sVar3);
          }
          duckdb::Value::~Value((Value *)local_170);
        }
        p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::FieldID>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::FieldID>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                   *)unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>,_true>
                     ::operator->(&local_e0->ids);
        local_170._0_8_ = local_170 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_170,local_100._M_dataplus._M_p,
                   local_100._M_dataplus._M_p + local_100._M_string_length);
        local_150 = (float)local_128;
        iStack_14c = local_128._4_4_;
        p_Stack_148 = &(_Stack_120._M_head_impl)->_M_h;
        _Stack_120._M_head_impl =
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
              *)0x0;
        pVar18 = std::
                 _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::FieldID>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::FieldID>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<std::__cxx11::string,duckdb::FieldID>>
                           (p_Var11,(string *)local_170);
        p_Var4 = p_Stack_148;
        if (p_Stack_148 !=
            (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)0x0) {
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(p_Stack_148);
          operator_delete(p_Var4);
        }
        p_Stack_148 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)0x0;
        if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
          operator_delete((void *)local_170._0_8_);
        }
        if (local_130.ptr != (const_reference)0x0) {
          pLVar15 = (LogicalType *)
                    ((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                           ._M_cur + 0x28);
          if (2 < (byte)(*(char *)((long)cVar8.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                         ._M_cur + 0x28) + 0x9cU)) {
            pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_170,
                       "Column \"%s\" with type \"%s\" cannot have a nested FIELD_IDS specification"
                       ,"");
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_100._M_dataplus._M_p,
                       local_100._M_dataplus._M_p + local_100._M_string_length);
            duckdb::LogicalTypeIdToString_abi_cxx11_((LogicalTypeId)&local_70);
            BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                      (pBVar14,(string *)local_170,&local_d0,&local_70);
            __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
          }
          optional_ptr<const_duckdb::Value,_true>::CheckValid(&local_130);
          oVar6.ptr = local_130.ptr;
          local_170._0_8_ = local_140;
          local_170._8_8_ = 1;
          local_170._16_8_ = (_Hash_node_base *)0x0;
          local_170._24_8_ = 0;
          local_150 = 1.0;
          p_Stack_148 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)0x0;
          local_140[0] = (__node_base_ptr)0x0;
          LVar1 = *pLVar15;
          if (LVar1 == (LogicalType)0x64) {
            puVar13 = (undefined8 *)duckdb::StructType::GetChildTypes_abi_cxx11_(pLVar15);
            pcVar2 = (char *)puVar13[1];
            for (pcVar10 = (char *)*puVar13; pcVar10 != pcVar2; pcVar10 = pcVar10 + 0x38) {
              iVar7 = std::__cxx11::string::compare(pcVar10);
              if (iVar7 == 0) {
                pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_190,"Cannot have column named \"%s\" with FIELD_IDS","")
                ;
                BinderException::BinderException<char_const*>
                          (pBVar14,&local_190,"__duckdb_field_id");
                __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
              }
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<std::__cxx11::string,duckdb::LogicalType>const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_170,pcVar10);
            }
          }
          else if (LVar1 == (LogicalType)0x66) {
            uVar12 = duckdb::MapType::KeyType(pLVar15);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<char_const(&)[4],duckdb::LogicalType_const&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_170,"key",uVar12);
            uVar12 = duckdb::MapType::ValueType(pLVar15);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<char_const(&)[6],duckdb::LogicalType_const&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_170,"value",uVar12);
          }
          else {
            if (LVar1 != (LogicalType)0x65) {
              this_00 = (InternalException *)__cxa_allocate_exception(0x10);
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_190,"Unexpected type in GetChildNameToTypeMap","");
              duckdb::InternalException::InternalException(this_00,(string *)&local_190);
              __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = duckdb::ListType::GetChildType(pLVar15);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<char_const(&)[8],duckdb::LogicalType_const&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_170,"element",uVar12);
          }
          GetFieldIDs(oVar6.ptr,
                      (ChildFieldIDs *)
                      ((long)pVar18.first.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_true>
                      + 0x30),(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_110,(case_insensitive_map_t<LogicalType> *)local_170);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_170);
        }
        _Var5._M_head_impl = _Stack_120._M_head_impl;
        name_to_type_map = (case_insensitive_map_t<LogicalType> *)local_118;
        if (&(_Stack_120._M_head_impl)->_M_h !=
            (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)0x0) {
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&(_Stack_120._M_head_impl)->_M_h);
          operator_delete(_Var5._M_head_impl);
          name_to_type_map = (case_insensitive_map_t<LogicalType> *)local_118;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(local_108->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_108->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  return;
}

Assistant:

static void GetFieldIDs(const Value &field_ids_value, ChildFieldIDs &field_ids,
                        unordered_set<uint32_t> &unique_field_ids,
                        const case_insensitive_map_t<LogicalType> &name_to_type_map) {
	const auto &struct_type = field_ids_value.type();
	if (struct_type.id() != LogicalTypeId::STRUCT) {
		throw BinderException(
		    "Expected FIELD_IDS to be a STRUCT, e.g., {col1: 42, col2: {%s: 43, nested_col: 44}, col3: 44}",
		    FieldID::DUCKDB_FIELD_ID);
	}
	const auto &struct_children = StructValue::GetChildren(field_ids_value);
	D_ASSERT(StructType::GetChildTypes(struct_type).size() == struct_children.size());
	for (idx_t i = 0; i < struct_children.size(); i++) {
		const auto &col_name = StringUtil::Lower(StructType::GetChildName(struct_type, i));
		if (col_name == FieldID::DUCKDB_FIELD_ID) {
			continue;
		}

		auto it = name_to_type_map.find(col_name);
		if (it == name_to_type_map.end()) {
			string names;
			for (const auto &name : name_to_type_map) {
				if (!names.empty()) {
					names += ", ";
				}
				names += name.first;
			}
			throw BinderException(
			    "Column name \"%s\" specified in FIELD_IDS not found. Consider using WRITE_PARTITION_COLUMNS if this "
			    "column is a partition column. Available column names: [%s]",
			    col_name, names);
		}
		D_ASSERT(field_ids.ids->find(col_name) == field_ids.ids->end()); // Caught by STRUCT - deduplicates keys

		const auto &child_value = struct_children[i];
		const auto &child_type = child_value.type();
		optional_ptr<const Value> field_id_value;
		optional_ptr<const Value> child_field_ids_value;

		if (child_type.id() == LogicalTypeId::STRUCT) {
			const auto &nested_children = StructValue::GetChildren(child_value);
			D_ASSERT(StructType::GetChildTypes(child_type).size() == nested_children.size());
			for (idx_t nested_i = 0; nested_i < nested_children.size(); nested_i++) {
				const auto &field_id_or_nested_col = StructType::GetChildName(child_type, nested_i);
				if (field_id_or_nested_col == FieldID::DUCKDB_FIELD_ID) {
					field_id_value = &nested_children[nested_i];
				} else {
					child_field_ids_value = &child_value;
				}
			}
		} else {
			field_id_value = &child_value;
		}

		FieldID field_id;
		if (field_id_value) {
			Value field_id_integer_value = field_id_value->DefaultCastAs(LogicalType::INTEGER);
			const uint32_t field_id_int = IntegerValue::Get(field_id_integer_value);
			if (!unique_field_ids.insert(field_id_int).second) {
				throw BinderException("Duplicate field_id %s found in FIELD_IDS", field_id_integer_value.ToString());
			}
			field_id = FieldID(UnsafeNumericCast<int32_t>(field_id_int));
		}
		auto inserted = field_ids.ids->insert(make_pair(col_name, std::move(field_id)));
		D_ASSERT(inserted.second);

		if (child_field_ids_value) {
			const auto &col_type = it->second;
			if (col_type.id() != LogicalTypeId::LIST && col_type.id() != LogicalTypeId::MAP &&
			    col_type.id() != LogicalTypeId::STRUCT) {
				throw BinderException("Column \"%s\" with type \"%s\" cannot have a nested FIELD_IDS specification",
				                      col_name, LogicalTypeIdToString(col_type.id()));
			}

			GetFieldIDs(*child_field_ids_value, inserted.first->second.child_field_ids, unique_field_ids,
			            GetChildNameToTypeMap(col_type));
		}
	}
}